

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O0

void __thiscall SSD1306::FileDescriptor::~FileDescriptor(FileDescriptor *this)

{
  bool bVar1;
  int *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  bVar1 = std::function<bool_(int)>::operator()
                    ((function<bool_(int)> *)
                     CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    close(*in_RDI);
  }
  std::function<bool_(int)>::~function((function<bool_(int)> *)0x10b6ec);
  return;
}

Assistant:

SSD1306::FileDescriptor::~FileDescriptor()
{
    if (close_if_(fd_))
    {
        ::close(fd_);
    }
}